

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

int bgzf_read_block(BGZF *fp)

{
  uint64_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint *puVar4;
  undefined8 *puVar5;
  kh_cache_t *h;
  khint64_t kVar6;
  khint32_t *pkVar7;
  cache_t *pcVar8;
  khint_t kVar9;
  int iVar10;
  off_t oVar11;
  ulong uVar12;
  ssize_t sVar13;
  z_stream *pzVar14;
  uint8_t *__dest;
  byte bVar15;
  sbyte sVar16;
  uint uVar17;
  khint_t kVar18;
  uint uVar19;
  hFILE *fp_00;
  int iVar20;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  uint uVar24;
  int *piVar25;
  khint_t kVar26;
  bool bVar27;
  bool bVar28;
  uint8_t header [18];
  long local_a0;
  int local_98;
  void *local_88;
  undefined4 local_80;
  uint local_78;
  undefined1 local_60 [16];
  
  fp_00 = fp->fp;
  if ((*(uint *)fp & 0x60000000) == 0) {
    sVar13 = hread(fp_00,fp->uncompressed_block,0x10000);
    iVar20 = (int)sVar13;
    if (iVar20 != 0) {
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = fp->block_address + (long)iVar20;
      fp->block_length = iVar20;
      return 0;
    }
LAB_00132ca5:
    fp->block_length = 0;
    return 0;
  }
  pcVar22 = fp_00->begin + (fp_00->offset - (long)fp_00->buffer);
  if (((int)*(uint *)fp < 0) && (fp->gz_stream != (z_stream *)0x0)) {
    iVar20 = inflate_gzip_block(fp,0);
    if (iVar20 < 0) {
      *(byte *)fp = *(byte *)fp | 1;
      return -1;
    }
    fp->block_length = iVar20;
    fp->block_address = (int64_t)pcVar22;
    return 0;
  }
  if (fp->cache_size != 0) {
    puVar4 = (uint *)fp->cache;
    uVar17 = *puVar4;
    if (uVar17 == 0) {
      uVar19 = 0;
LAB_00132a76:
      if (uVar19 != uVar17) {
        piVar25 = (int *)((ulong)uVar19 * 0x18 + *(long *)(puVar4 + 8));
        if (fp->block_length != 0) {
          fp->block_offset = 0;
        }
        fp->block_address = (int64_t)pcVar22;
        fp->block_length = *piVar25;
        memcpy(fp->uncompressed_block,*(void **)(piVar25 + 2),0x10000);
        oVar11 = hseek(fp->fp,*(off_t *)(piVar25 + 4),0);
        if (oVar11 < 0) {
          fprintf(_stderr,"Could not hseek to %ld\n",*(undefined8 *)(piVar25 + 4));
          exit(1);
        }
        if (*piVar25 != 0) {
          return 0;
        }
        fp_00 = fp->fp;
      }
    }
    else {
      iVar20 = 1;
      uVar21 = ((uint)((ulong)pcVar22 >> 0x21) ^ (uint)pcVar22 << 0xb ^ (uint)pcVar22) & uVar17 - 1;
      uVar19 = uVar21;
      do {
        uVar24 = *(uint *)(*(long *)(puVar4 + 4) + (ulong)(uVar19 >> 4) * 4);
        bVar15 = (char)uVar19 * '\x02' & 0x1e;
        uVar23 = uVar24 >> bVar15;
        if (((uVar23 & 2) != 0) ||
           (((uVar23 & 1) == 0 && (*(char **)(*(long *)(puVar4 + 6) + (ulong)uVar19 * 8) == pcVar22)
            ))) {
          if ((uVar24 >> bVar15 & 3) != 0) {
            uVar19 = uVar17;
          }
          goto LAB_00132a76;
        }
        uVar19 = uVar19 + iVar20 & uVar17 - 1;
        iVar20 = iVar20 + 1;
      } while (uVar19 != uVar21);
    }
  }
  uVar12 = hread(fp_00,header,0x12);
  if ((uVar12 & 0xffffffff) == 0) goto LAB_00132ca5;
  if (((((int)uVar12 != 0x12) || (header[0] != '\x1f')) || (header[1] != 0x8b)) ||
     (header[2] != '\b')) {
    *(byte *)fp = *(byte *)fp | 2;
    return -1;
  }
  if ((((header[3] & 4) == 0) || (header._10_2_ != 6)) ||
     ((header[0xc] != 'B' || ((header[0xd] != 'C' || (header._14_2_ != 2)))))) {
    puVar5 = (undefined8 *)fp->compressed_block;
    *(undefined2 *)(puVar5 + 2) = header._16_2_;
    *puVar5 = CONCAT44(header._4_4_,CONCAT13(header[3],0x88b1f));
    puVar5[1] = CONCAT26(header._14_2_,
                         CONCAT15(header[0xd],
                                  CONCAT14(header[0xc],CONCAT22(header._10_2_,header._8_2_))));
    sVar13 = hread(fp->fp,(void *)((long)puVar5 + 0x12),0xfeee);
    if ((header[3] & 4) == 0) {
      uVar17 = 10;
    }
    else {
      uVar17 = *(ushort *)((long)puVar5 + 10) + 0xc;
    }
    if ((header[3] & 8) != 0) {
      for (uVar12 = (ulong)uVar17; uVar12 < 0xff00; uVar12 = uVar12 + 1) {
        if (*(char *)((long)puVar5 + uVar12) == '\0') goto LAB_00132d31;
      }
      if (uVar12 == 0xff00) goto LAB_00132d59;
LAB_00132d31:
      uVar17 = (int)uVar12 + 1;
    }
    if ((header[3] & 0x10) != 0) {
      for (uVar12 = (ulong)uVar17; uVar12 < 0xff00; uVar12 = uVar12 + 1) {
        if (*(char *)((long)puVar5 + uVar12) == '\0') goto LAB_00132d5e;
      }
      if (uVar12 == 0xff00) {
LAB_00132d59:
        *(byte *)fp = *(byte *)fp | 2;
        return -1;
      }
LAB_00132d5e:
      uVar17 = (int)uVar12 + 1;
    }
    fp->field_0x3 = fp->field_0x3 | 0x80;
    pzVar14 = (z_stream *)calloc(1,0x70);
    fp->gz_stream = pzVar14;
    iVar20 = inflateInit2_(pzVar14,0xfffffffffffffff1,"1.2.11",0x70);
    if (iVar20 == 0) {
      uVar17 = uVar17 + (header[3] & 2);
      pzVar14 = fp->gz_stream;
      pzVar14->avail_in = ((int)sVar13 + 0x12) - uVar17;
      pzVar14->next_in = (Bytef *)((long)puVar5 + (ulong)uVar17);
      iVar20 = inflate_gzip_block(fp,1);
      if (-1 < iVar20) {
        fp->block_length = iVar20;
        fp->block_address = (int64_t)pcVar22;
        return -(uint)(fp->idx_build_otf != 0);
      }
    }
  }
  else {
    puVar5 = (undefined8 *)fp->compressed_block;
    *(undefined2 *)(puVar5 + 2) = header._16_2_;
    *puVar5 = CONCAT44(header._4_4_,CONCAT13(header[3],0x88b1f));
    puVar5[1] = CONCAT26(2,CONCAT15(0x43,CONCAT14(0x42,CONCAT22(6,header._8_2_))));
    sVar13 = hread(fp->fp,(void *)((long)puVar5 + 0x12),(ulong)(ushort)header._16_2_ - 0x11);
    if ((int)((ulong)(ushort)header._16_2_ - 0x11) != (int)sVar13) {
      *(byte *)fp = *(byte *)fp | 4;
      return -1;
    }
    local_60 = (undefined1  [16])0x0;
    local_a0 = (long)fp->compressed_block + 0x12;
    local_98 = (ushort)header._16_2_ - 0xf;
    local_88 = fp->uncompressed_block;
    local_80 = 0x10000;
    iVar20 = inflateInit2_(&local_a0,0xfffffffffffffff1,"1.2.11",0x70);
    if (iVar20 == 0) {
      iVar20 = inflate(&local_a0,4);
      iVar10 = inflateEnd(&local_a0);
      if (iVar10 != 0 || iVar20 != 1) goto LAB_00132d8c;
      if ((int)local_78 < 0) {
        return -1;
      }
      if (fp->block_length != 0) {
        fp->block_offset = 0;
      }
      fp->block_address = (int64_t)pcVar22;
      fp->block_length = local_78;
      if (fp->idx_build_otf != 0) {
        bgzf_index_add_block(fp);
        puVar1 = &fp->idx->ublock_addr;
        *puVar1 = *puVar1 + (ulong)(local_78 & 0x7fffffff);
      }
      if (fp->cache_size < 0x10001) {
        return 0;
      }
      h = (kh_cache_t *)fp->cache;
      kVar26 = h->n_buckets;
      if ((uint)fp->cache_size < h->size * 0x10000 + 0x10000) {
        uVar17 = 0;
        for (uVar19 = 0; kVar26 != uVar19; uVar19 = uVar19 + 1) {
          uVar24 = 3 << (sbyte)(uVar17 & 0x1e);
          uVar21 = uVar19 >> 4;
          if ((h->flags[uVar21] & uVar24) == 0) {
            free(h->vals[uVar19].block);
            kVar26 = uVar19;
            if (h->n_buckets != uVar19) {
              uVar19 = h->flags[uVar21];
              kVar26 = h->n_buckets;
              if ((uVar19 & uVar24) == 0) {
                h->flags[uVar21] = uVar19 | 1 << (uVar17 & 0x1e);
                h->size = h->size - 1;
                kVar26 = h->n_buckets;
              }
            }
            break;
          }
          uVar17 = uVar17 + 2;
        }
      }
      kVar6 = fp->block_address;
      if (h->upper_bound <= h->n_occupied) {
        if (h->size * 2 < kVar26) {
          kVar26 = kVar26 - 1;
        }
        else {
          kVar26 = kVar26 + 1;
        }
        iVar20 = kh_resize_cache(h,kVar26);
        kVar26 = h->n_buckets;
        if (iVar20 < 0) goto LAB_00132fb3;
      }
      uVar17 = ((uint)(kVar6 >> 0x21) ^ (uint)kVar6 << 0xb ^ (uint)kVar6) & kVar26 - 1;
      pkVar7 = h->flags;
      kVar9 = uVar17;
      if ((pkVar7[uVar17 >> 4] >> ((char)uVar17 * '\x02' & 0x1fU) & 2) == 0) {
        iVar20 = 1;
        kVar18 = kVar26;
        uVar19 = uVar17;
        do {
          uVar21 = pkVar7[uVar19 >> 4];
          uVar24 = uVar19 * 2 & 0x1e;
          sVar16 = (sbyte)uVar24;
          uVar23 = uVar21 >> sVar16;
          if (((uVar23 & 2) != 0) || (((uVar23 & 1) == 0 && (h->keys[uVar19] == kVar6)))) {
            bVar28 = (uVar21 >> sVar16 & 2) == 0;
            goto LAB_00132f3b;
          }
          if ((uVar21 >> uVar24 & 1) != 0) {
            kVar18 = uVar19;
          }
          uVar19 = uVar19 + iVar20 & kVar26 - 1;
          iVar20 = iVar20 + 1;
        } while (uVar19 != uVar17);
        bVar28 = true;
        bVar27 = kVar18 == kVar26;
        kVar9 = kVar18;
        uVar19 = uVar17;
        kVar18 = kVar26;
        if (bVar27) {
LAB_00132f3b:
          if (kVar18 == kVar26) {
            kVar18 = uVar19;
          }
          kVar9 = kVar18;
          if (bVar28) {
            kVar9 = uVar19;
          }
        }
      }
      kVar26 = kVar9;
      uVar19 = kVar26 >> 4;
      uVar17 = pkVar7[uVar19];
      bVar15 = (char)kVar26 * '\x02' & 0x1e;
      if ((uVar17 >> bVar15 & 2) == 0) {
        if ((uVar17 >> bVar15 & 1) == 0) {
          return 0;
        }
        h->keys[kVar26] = kVar6;
        pkVar7[uVar19] = uVar17 & ~(3 << bVar15);
        h->size = h->size + 1;
      }
      else {
        h->keys[kVar26] = kVar6;
        pkVar7[uVar19] = uVar17 & ~(3 << bVar15);
        uVar2 = h->size;
        uVar3 = h->n_occupied;
        h->size = uVar2 + 1;
        h->n_occupied = uVar3 + 1;
      }
LAB_00132fb3:
      pcVar8 = h->vals;
      pcVar8[kVar26].size = fp->block_length;
      pcVar8[kVar26].end_offset = (long)((int)sVar13 + 0x12) + fp->block_address;
      __dest = (uint8_t *)malloc(0x10000);
      pcVar8[kVar26].block = __dest;
      memcpy(__dest,fp->uncompressed_block,0x10000);
      return 0;
    }
  }
LAB_00132d8c:
  *(byte *)fp = *(byte *)fp | 1;
  return -1;
}

Assistant:

int bgzf_read_block(BGZF *fp)
{
    uint8_t header[BLOCK_HEADER_LENGTH], *compressed_block;
    int count, size = 0, block_length, remaining;

    // Reading an uncompressed file
    if ( !fp->is_compressed )
    {
        count = hread(fp->fp, fp->uncompressed_block, BGZF_MAX_BLOCK_SIZE);
        if ( count==0 )
        {
            fp->block_length = 0;
            return 0;
        }
        if (fp->block_length != 0) fp->block_offset = 0;
        fp->block_address += count;
        fp->block_length = count;
        return 0;
    }

    // Reading compressed file
    int64_t block_address;
    block_address = htell(fp->fp);
    if ( fp->is_gzip && fp->gz_stream ) // is this is a initialized gzip stream?
    {
        count = inflate_gzip_block(fp, 0);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        return 0;
    }
    if (fp->cache_size && load_block_from_cache(fp, block_address)) return 0;
    count = hread(fp->fp, header, sizeof(header));
    if (count == 0) { // no data read
        fp->block_length = 0;
        return 0;
    }
    int ret;
    if ( count != sizeof(header) || (ret=check_header(header))==-2 )
    {
        fp->errcode |= BGZF_ERR_HEADER;
        return -1;
    }
    if ( ret==-1 )
    {
        // GZIP, not BGZF
        uint8_t *cblock = (uint8_t*)fp->compressed_block;
        memcpy(cblock, header, sizeof(header));
        count = hread(fp->fp, cblock+sizeof(header), BGZF_BLOCK_SIZE - sizeof(header)) + sizeof(header);
        int nskip = 10;

        // Check optional fields to skip: FLG.FNAME,FLG.FCOMMENT,FLG.FHCRC,FLG.FEXTRA
        // Note: Some of these fields are untested, I did not have appropriate data available
        if ( header[3] & 0x4 ) // FLG.FEXTRA
        {
            nskip += unpackInt16(&cblock[nskip]) + 2;
        }
        if ( header[3] & 0x8 ) // FLG.FNAME
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x10 ) // FLG.FCOMMENT
        {
            while ( nskip<BGZF_BLOCK_SIZE && cblock[nskip] ) nskip++;
            if ( nskip==BGZF_BLOCK_SIZE )
            {
                fp->errcode |= BGZF_ERR_HEADER;
                return -1;
            }
            nskip++;
        }
        if ( header[3] & 0x2 ) nskip += 2;  //  FLG.FHCRC

        fp->is_gzip = 1;
        fp->gz_stream = (z_stream*) calloc(1,sizeof(z_stream));
        int ret = inflateInit2(fp->gz_stream, -15);
        if (ret != Z_OK)
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->gz_stream->avail_in = count - nskip;
        fp->gz_stream->next_in  = cblock + nskip;
        count = inflate_gzip_block(fp, 1);
        if ( count<0 )
        {
            fp->errcode |= BGZF_ERR_ZLIB;
            return -1;
        }
        fp->block_length = count;
        fp->block_address = block_address;
        if ( fp->idx_build_otf ) return -1; // cannot build index for gzip
        return 0;
    }
    size = count;
    block_length = unpackInt16((uint8_t*)&header[16]) + 1; // +1 because when writing this number, we used "-1"
    compressed_block = (uint8_t*)fp->compressed_block;
    memcpy(compressed_block, header, BLOCK_HEADER_LENGTH);
    remaining = block_length - BLOCK_HEADER_LENGTH;
    count = hread(fp->fp, &compressed_block[BLOCK_HEADER_LENGTH], remaining);
    if (count != remaining) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    size += count;
    if ((count = inflate_block(fp, block_length)) < 0) return -1;
    if (fp->block_length != 0) fp->block_offset = 0; // Do not reset offset if this read follows a seek.
    fp->block_address = block_address;
    fp->block_length = count;
    if ( fp->idx_build_otf )
    {
        bgzf_index_add_block(fp);
        fp->idx->ublock_addr += count;
    }
    cache_block(fp, size);
    return 0;
}